

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O2

bool __thiscall pstore::broker::gc_watch_thread::stop_vacuum(gc_watch_thread *this,string *path)

{
  int *piVar1;
  maybe<int,_void> pid;
  not_null<const_char_*> local_30;
  not_null<const_char_*> local_28;
  
  get_pid(&pid,this,path);
  if (pid.valid_ == true) {
    local_28.ptr_ = (path->_M_dataplus)._M_p;
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_28);
    log<pstore::logger::quoted>(info,"Killing GC for ",(quoted)local_28.ptr_);
    piVar1 = maybe<int,_void>::operator->(&pid);
    (*this->_vptr_gc_watch_thread[3])(this,piVar1);
    bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>>::
    erasel<std::__cxx11::string>
              ((bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>> *)
               &this->processes_,path);
  }
  else {
    local_30.ptr_ = (path->_M_dataplus)._M_p;
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_30);
    log<pstore::logger::quoted>(info,"No GC process running for ",(quoted)local_30.ptr_);
  }
  return pid.valid_;
}

Assistant:

bool gc_watch_thread::stop_vacuum (std::string const & path) {
            if (maybe<process_identifier> const pid = this->get_pid (path)) {
                log (priority::info, "Killing GC for ", logger::quoted{path.c_str ()});
                this->kill (*pid);
                processes_.erasel (path);
                return true;
            }
            log (priority::info, "No GC process running for ", logger::quoted{path.c_str ()});
            return false;
        }